

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_goto_tb(DisasContext_conflict14 *ctx,int n,target_ulong_conflict dest)

{
  TCGContext_conflict9 *tcg_ctx;
  TCGContext_conflict9 *tcg_ctx_00;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if (((ctx->base).singlestep_enabled == false) && ((((ctx->base).tb)->pc ^ dest) < 0x4000)) {
    tcg_gen_goto_tb_tricore(tcg_ctx,n);
    tcg_ctx_00 = ctx->uc->tcg_ctx;
    tcg_gen_op2_tricore(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(tcg_ctx_00->cpu_PC + (long)tcg_ctx_00)
                        ,(long)(int)dest);
    tcg_gen_exit_tb_tricore(tcg_ctx,(TranslationBlock *)(ctx->base).tb,n);
    return;
  }
  gen_goto_tb_cold_1();
  return;
}

Assistant:

static inline void gen_goto_tb(DisasContext *s, int tb_num,
                               target_ulong pc, target_ulong npc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (use_goto_tb(s, pc, npc))  {
        /* jump to same page: we can use a direct jump */
        tcg_gen_goto_tb(tcg_ctx, tb_num);
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, pc);
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_npc, npc);
        tcg_gen_exit_tb(tcg_ctx, s->base.tb, tb_num);
    } else {
        /* jump to another page: currently not optimized */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, pc);
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_npc, npc);
        tcg_gen_exit_tb(tcg_ctx, NULL, 0);
    }
}